

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void http_mimetype_clear(void)

{
  fio_mime_set__ordered_s_ *pos;
  fio_mime_set__ordered_s_ *pfVar1;
  fio_mime_set__ordered_s_ *pfVar2;
  
  if (0 < (long)fio_http_mime_types.pos &&
      fio_http_mime_types.ordered != (fio_mime_set__ordered_s_ *)0x0) {
    pfVar2 = fio_http_mime_types.ordered + fio_http_mime_types.pos;
    pfVar1 = fio_http_mime_types.ordered;
    do {
      if (pfVar1->hash != 0) {
        fiobj_free(pfVar1->obj);
      }
      pfVar1 = pfVar1 + 1;
    } while (pfVar1 < pfVar2);
  }
  free(fio_http_mime_types.map);
  free(fio_http_mime_types.ordered);
  fio_http_mime_types.map = (fio_mime_set__map_s_ *)0x0;
  fio_http_mime_types.has_collisions = '\0';
  fio_http_mime_types.used_bits = '\0';
  fio_http_mime_types.under_attack = '\0';
  fio_http_mime_types._43_5_ = 0;
  fio_http_mime_types.pos = 0;
  fio_http_mime_types.ordered = (fio_mime_set__ordered_s_ *)0x0;
  fio_http_mime_types.count = 0;
  fio_http_mime_types.capa = 0;
  fiobj_free(current_date);
  current_date = 0;
  last_date_added = 0;
  return;
}

Assistant:

void http_mimetype_clear(void) {
  fio_mime_set_free(&fio_http_mime_types);
  fiobj_free(current_date);
  current_date = FIOBJ_INVALID;
  last_date_added = 0;
}